

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall
soplex::SLUFactor<double>::solve3right4update
          (SLUFactor<double> *this,SSVectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *y2,SVectorBase<double> *b,SSVectorBase<double> *rhs,
          SSVectorBase<double> *rhs2)

{
  double dVar1;
  int rn3;
  int iVar2;
  int iVar3;
  int iVar4;
  int *ridx;
  int *ridx2;
  int *ridx3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pdVar5;
  pointer pdVar6;
  int *piVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *rhs3;
  int *forestIdx;
  double *forest;
  Real eps;
  Real RVar13;
  int iVar14;
  long lVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  vector<double,_std::allocator<double>_> *__range2;
  vector<double,_std::allocator<double>_> *__range2_1;
  int f;
  
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  iVar14 = (rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  ridx2 = (rhs->super_IdxSet).idx;
  rn3 = (rhs2->super_IdxSet).num;
  rhs2->setupStatus = false;
  ridx3 = (rhs2->super_IdxSet).idx;
  this_00 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  eps = Tolerances::epsilon(this_00);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<double>::clear(x);
  pdVar5 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 != pdVar6) {
    memset(pdVar5,0,(long)pdVar6 - (long)pdVar5 & 0xfffffffffffffff8);
  }
  pdVar5 = (y2->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (y2->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 != pdVar6) {
    memset(pdVar5,0,(long)pdVar6 - (long)pdVar5 & 0xfffffffffffffff8);
  }
  this->usetup = true;
  SSVectorBase<double>::clear(&this->ssvec);
  iVar2 = b->memused;
  (this->ssvec).super_IdxSet.num = 0;
  if (0 < (long)iVar2) {
    lVar15 = 0;
    do {
      iVar3 = *(int *)((long)&b->m_elem->idx + lVar15);
      dVar1 = *(double *)((long)&b->m_elem->val + lVar15);
      RVar13 = Tolerances::epsilon((this->ssvec)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      pdVar5 = (this->ssvec).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar16 = 0;
      uVar17 = 0;
      if (RVar13 < ABS(dVar1)) {
        piVar7 = (this->ssvec).super_IdxSet.idx;
        iVar4 = (this->ssvec).super_IdxSet.num;
        (this->ssvec).super_IdxSet.num = iVar4 + 1;
        piVar7[iVar4] = iVar3;
        uVar16 = SUB84(dVar1,0);
        uVar17 = (undefined4)((ulong)dVar1 >> 0x20);
      }
      pdVar5[iVar3] = (double)CONCAT44(uVar17,uVar16);
      lVar15 = lVar15 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar15);
  }
  (this->ssvec).setupStatus = true;
  if ((this->super_CLUFactor<double>).l.updateType == 0) {
    iVar2 = (this->ssvec).super_IdxSet.num;
    piVar7 = (x->super_IdxSet).idx;
    pdVar8 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pdVar9 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar10 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    rhs->setupStatus = false;
    pdVar11 = (rhs->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pdVar12 = (y2->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    rhs2->setupStatus = false;
    iVar14 = CLUFactor<double>::vSolveRight4update3
                       (&this->super_CLUFactor<double>,eps,pdVar8,piVar7,pdVar9,ridx,iVar2,pdVar10,
                        eps,pdVar11,ridx2,iVar14,pdVar12,eps,
                        (rhs2->super_VectorBase<double>).val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,ridx3,rn3,(double *)0x0,(int *)0x0,
                        (int *)0x0);
    (x->super_IdxSet).num = iVar14;
    x->setupStatus = false;
    SSVectorBase<double>::setup_and_assign<double>(&this->eta,x);
  }
  else {
    SSVectorBase<double>::clear(&this->forest);
    iVar2 = (this->ssvec).super_IdxSet.num;
    piVar7 = (x->super_IdxSet).idx;
    pdVar8 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pdVar9 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar10 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    rhs->setupStatus = false;
    pdVar11 = (rhs->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pdVar12 = (y2->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    rhs2->setupStatus = false;
    rhs3 = (rhs2->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
    forestIdx = (this->forest).super_IdxSet.idx;
    forest = (this->forest).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (this->forest).setupStatus = false;
    iVar14 = CLUFactor<double>::vSolveRight4update3
                       (&this->super_CLUFactor<double>,eps,pdVar8,piVar7,pdVar9,ridx,iVar2,pdVar10,
                        eps,pdVar11,ridx2,iVar14,pdVar12,eps,rhs3,ridx3,rn3,forest,&f,forestIdx);
    (x->super_IdxSet).num = iVar14;
    x->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  rhs2->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 3;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve3right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   VectorBase<R>&        y2,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs,
   SSVectorBase<R>&       rhs2)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   int  rsize2 = rhs2.size();
   int* ridx2 = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   y2.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   rhs2.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}